

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O3

void __thiscall pbrt::SemanticParser::extractTextures(SemanticParser *this,SP *geom,SP *shape)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  param;
  undefined1 local_98 [16];
  undefined1 local_88 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_60;
  
  peVar1 = (shape->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (peVar1->super_Node).super_ParamSet.param._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  p_Var5 = &(peVar1->super_Node).super_ParamSet.param._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_60,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var4 + 1));
      (**(local_60.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->_vptr_Param)((SemanticParser *)local_88);
      iVar2 = std::__cxx11::string::compare((char *)local_88);
      if ((element_type *)local_88._0_8_ != (element_type *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_);
      }
      if (iVar2 == 0) {
        syntactic::ParamSet::getParamTexture
                  ((ParamSet *)local_98,
                   (string *)
                   &(((shape->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->super_Node).super_ParamSet);
        findOrCreateTexture((SemanticParser *)local_88,(SP *)this);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
                 ::operator[](&((geom->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->textures,&local_60.first);
        this_00 = (pmVar3->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        (pmVar3->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)local_88._0_8_;
        (pmVar3->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
      }
      if (local_60.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
        operator_delete(local_60.first._M_dataplus._M_p);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  return;
}

Assistant:

void SemanticParser::extractTextures(Shape::SP geom, pbrt::syntactic::Shape::SP shape)
  {
    for (auto param : shape->param) {
      if (param.second->getType() != "texture")
        continue;

      geom->textures[param.first] = findOrCreateTexture(shape->getParamTexture(param.first));//param.second);
    }
  }